

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

bool CoreML::hasSufficientBytesInQuantizedWeightParam(WeightParams *weight,uint64_t units)

{
  int iVar1;
  QuantizationParams *pQVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  uint uVar6;
  QuantizationParams *pQVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  
  pQVar2 = weight->quantization_;
  pQVar7 = pQVar2;
  if (pQVar2 == (QuantizationParams *)0x0) {
    pQVar7 = (QuantizationParams *)&Specification::_QuantizationParams_default_instance_;
  }
  iVar1 = (weight->floatvalue_).current_size_;
  sVar3 = ((weight->float16value_).ptr_)->_M_string_length;
  uVar9 = (0 < iVar1) + 1;
  if (sVar3 == 0) {
    uVar9 = (uint)(0 < iVar1);
  }
  sVar4 = ((weight->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((weight->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar9 = (uVar9 - (sVar4 == 0)) + 2;
  iVar10 = 0;
  if (uVar9 - uVar6 < 2) {
    if (((sVar3 == 0) && (iVar1 < 1)) && (uVar9 != uVar6)) {
      if ((sVar4 == 0) ||
         (weight == (WeightParams *)&Specification::_WeightParams_default_instance_ ||
          pQVar2 == (QuantizationParams *)0x0)) {
        if (sVar5 != 0) {
          iVar10 = (int)sVar5;
          if (pQVar2 == (QuantizationParams *)0x0) {
            iVar10 = 0;
          }
          if (weight == (WeightParams *)&Specification::_WeightParams_default_instance_) {
            iVar10 = 0;
          }
        }
      }
      else {
        iVar10 = (int)sVar4;
      }
    }
    else {
      cVar8 = '\x05';
      if (uVar9 != uVar6) {
        cVar8 = iVar1 < 1;
      }
      if (cVar8 == '\x01') {
        iVar10 = (int)sVar3;
      }
      else if (cVar8 == '\0') {
        iVar10 = iVar1 << 2;
      }
    }
  }
  return pQVar7->numberofbits_ * units + 7 >> 3 <= (ulong)(long)iVar10;
}

Assistant:

inline const ::CoreML::Specification::QuantizationParams& WeightParams::quantization() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.WeightParams.quantization)
  return quantization_ != NULL ? *quantization_
                         : *::CoreML::Specification::QuantizationParams::internal_default_instance();
}